

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

TestCase * TestCharReaderTestparseChineseWithOneError::factory(void)

{
  TestCase *pTVar1;
  TestCharReaderTestparseChineseWithOneError *in_stack_fffffffffffffff0;
  
  pTVar1 = (TestCase *)operator_new(0x10);
  pTVar1->_vptr_TestCase = (_func_int **)0x0;
  pTVar1->result_ = (TestResult *)0x0;
  TestCharReaderTestparseChineseWithOneError(in_stack_fffffffffffffff0);
  return pTVar1;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseChineseWithOneError) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
      "{ \"pr佐藤erty\" :: \"value\" }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(errs ==
                  "* Line 1, Column 19\n  Syntax error: value, object or array "
                  "expected.\n");
  delete reader;
}